

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

long64 __thiscall ClipperLib::Clipper::PopScanbeam(Clipper *this)

{
  long64 lVar1;
  Scanbeam *pSVar2;
  Scanbeam *sb2;
  long64 Y;
  Clipper *this_local;
  
  lVar1 = this->m_Scanbeam->Y;
  pSVar2 = this->m_Scanbeam;
  this->m_Scanbeam = this->m_Scanbeam->next;
  if (pSVar2 != (Scanbeam *)0x0) {
    operator_delete(pSVar2,0x10);
  }
  return lVar1;
}

Assistant:

long64 Clipper::PopScanbeam()
{
  long64 Y = m_Scanbeam->Y;
  Scanbeam* sb2 = m_Scanbeam;
  m_Scanbeam = m_Scanbeam->next;
  delete sb2;
  return Y;
}